

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_only.c
# Opt level: O2

void getRandomBlock(int ndim,int *dims,int *blocksize,int *lo,int *hi)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)ndim;
  if (ndim < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    iVar1 = rand();
    iVar1 = iVar1 % (dims[uVar2] - blocksize[uVar2]);
    lo[uVar2] = iVar1;
    hi[uVar2] = blocksize[uVar2] + iVar1 + -1;
  }
  return;
}

Assistant:

void getRandomBlock( int ndim, int dims[], int blocksize[], int lo[], int hi[])
{
  int toss;
  int d;
  for (d=0; d<ndim; d++) {
    toss = rand()%(dims[d]-blocksize[d]);
    lo[d] = toss;
    hi[d] = toss+blocksize[d]-1;
  }
}